

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  bool bVar1;
  ParseFlags PVar2;
  int iVar3;
  size_type sVar4;
  const_reference pcVar5;
  ostream *poVar6;
  const_pointer pcVar7;
  const_pointer pcVar8;
  const_pointer pcVar9;
  StringPiece *in_RSI;
  ParseFlags *in_RDI;
  bool done;
  Rune c;
  int nflags;
  bool sawflags;
  bool negated;
  StringPiece name;
  StringPiece capture;
  size_t end;
  StringPiece t;
  StringPiece *in_stack_fffffffffffffdb8;
  LogMessage *in_stack_fffffffffffffdc0;
  RegexpStatus *this_00;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  ParseState *in_stack_fffffffffffffdd0;
  StringPiece *in_stack_fffffffffffffdd8;
  ParseState *in_stack_fffffffffffffde0;
  StringPiece *this_01;
  RegexpStatus *in_stack_fffffffffffffde8;
  LogMessage *this_02;
  LogMessage *in_stack_fffffffffffffdf0;
  StringPiece local_200;
  byte local_1ed;
  int local_1ec;
  ParseFlags local_1e8;
  byte local_1e2;
  byte local_1e1;
  StringPiece local_1e0;
  StringPiece local_1d0;
  size_type local_1c0;
  LogMessage local_1a8;
  StringPiece local_28;
  StringPiece *local_18;
  bool local_1;
  
  local_28.data_ = in_RSI->data_;
  local_28.size_ = in_RSI->size_;
  local_18 = in_RSI;
  PVar2 = operator&(*in_RDI,PerlX);
  if ((((PVar2 == NoParseFlags) || (sVar4 = StringPiece::size(&local_28), sVar4 < 2)) ||
      (pcVar5 = StringPiece::operator[](&local_28,0), *pcVar5 != '(')) ||
     (pcVar5 = StringPiece::operator[](&local_28,1), *pcVar5 != '?')) {
    this_02 = &local_1a8;
    LogMessage::LogMessage
              (in_stack_fffffffffffffdf0,&this_02->flushed_,
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    poVar6 = LogMessage::stream(this_02);
    std::operator<<(poVar6,"Bad call to ParseState::ParsePerlFlags");
    LogMessage::~LogMessage(in_stack_fffffffffffffdc0);
    RegexpStatus::set_code(*(RegexpStatus **)(in_RDI + 6),kRegexpInternalError);
    local_1 = false;
  }
  else {
    StringPiece::remove_prefix(&local_28,2);
    sVar4 = StringPiece::size(&local_28);
    if (((sVar4 < 3) || (pcVar5 = StringPiece::operator[](&local_28,0), *pcVar5 != 'P')) ||
       (pcVar5 = StringPiece::operator[](&local_28,1), *pcVar5 != '<')) {
      local_1e1 = 0;
      local_1e2 = 0;
      local_1e8 = *in_RDI;
      local_1ed = 0;
      while (((local_1ed ^ 0xff) & 1) != 0) {
        sVar4 = StringPiece::size(&local_28);
        if (sVar4 == 0) goto LAB_002505cb;
        iVar3 = StringPieceToRune((Rune *)in_RDI,(StringPiece *)in_stack_fffffffffffffdf0,
                                  in_stack_fffffffffffffde8);
        if (iVar3 < 0) {
          return false;
        }
        if (local_1ec == 0x29) {
          local_1ed = 1;
        }
        else if (local_1ec == 0x2d) {
          if ((local_1e1 & 1) != 0) goto LAB_002505cb;
          local_1e1 = 1;
          local_1e2 = 0;
        }
        else if (local_1ec == 0x3a) {
          bVar1 = DoLeftParenNoCapture(in_stack_fffffffffffffdd0);
          if (!bVar1) {
            return false;
          }
          local_1ed = 1;
        }
        else if (local_1ec == 0x55) {
          local_1e2 = 1;
          if ((local_1e1 & 1) == 0) {
            local_1e8 = local_1e8 | NonGreedy;
          }
          else {
            PVar2 = operator~(NonGreedy);
            local_1e8 = PVar2 & local_1e8;
          }
        }
        else if (local_1ec == 0x69) {
          local_1e2 = 1;
          if ((local_1e1 & 1) == 0) {
            local_1e8 = local_1e8 | FoldCase;
          }
          else {
            PVar2 = operator~(FoldCase);
            local_1e8 = PVar2 & local_1e8;
          }
        }
        else if (local_1ec == 0x6d) {
          local_1e2 = 1;
          if ((local_1e1 & 1) == 0) {
            PVar2 = operator~(OneLine);
            local_1e8 = PVar2 & local_1e8;
          }
          else {
            local_1e8 = local_1e8 | OneLine;
          }
        }
        else {
          if (local_1ec != 0x73) goto LAB_002505cb;
          local_1e2 = 1;
          if ((local_1e1 & 1) == 0) {
            local_1e8 = local_1e8 | DotNL;
          }
          else {
            PVar2 = operator~(DotNL);
            local_1e8 = PVar2 & local_1e8;
          }
        }
      }
      if (((local_1e1 & 1) == 0) || ((local_1e2 & 1) != 0)) {
        *in_RDI = local_1e8;
        local_18->data_ = local_28.data_;
        local_18->size_ = local_28.size_;
        local_1 = true;
      }
      else {
LAB_002505cb:
        RegexpStatus::set_code(*(RegexpStatus **)(in_RDI + 6),kRegexpBadPerlOp);
        this_00 = *(RegexpStatus **)(in_RDI + 6);
        pcVar7 = StringPiece::data(local_18);
        pcVar8 = StringPiece::data(&local_28);
        pcVar9 = StringPiece::data(local_18);
        StringPiece::StringPiece(&local_200,pcVar7,(long)pcVar8 - (long)pcVar9);
        RegexpStatus::set_error_arg(this_00,&local_200);
        local_1 = false;
      }
    }
    else {
      local_1c0 = StringPiece::find((StringPiece *)
                                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                                    (char)((ulong)in_stack_fffffffffffffdc0 >> 0x38),
                                    (size_type)in_stack_fffffffffffffdb8);
      if (local_1c0 == 0xffffffffffffffff) {
        bVar1 = IsValidUTF8((StringPiece *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                            (RegexpStatus *)in_stack_fffffffffffffdc0);
        if (bVar1) {
          RegexpStatus::set_code(*(RegexpStatus **)(in_RDI + 6),kRegexpBadNamedCapture);
          RegexpStatus::set_error_arg(*(RegexpStatus **)(in_RDI + 6),local_18);
          local_1 = false;
        }
        else {
          local_1 = false;
        }
      }
      else {
        pcVar7 = StringPiece::data(&local_28);
        StringPiece::StringPiece(&local_1d0,pcVar7 + -2,local_1c0 + 3);
        pcVar7 = StringPiece::data(&local_28);
        StringPiece::StringPiece(&local_1e0,pcVar7 + 2,local_1c0 - 2);
        bVar1 = IsValidUTF8((StringPiece *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                            (RegexpStatus *)in_stack_fffffffffffffdc0);
        if (bVar1) {
          bVar1 = IsValidCaptureName(in_stack_fffffffffffffdb8);
          if (bVar1) {
            bVar1 = DoLeftParen(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            if (bVar1) {
              this_01 = local_18;
              pcVar7 = StringPiece::data(&local_1d0);
              sVar4 = StringPiece::size(&local_1d0);
              pcVar7 = pcVar7 + sVar4;
              pcVar8 = StringPiece::data(local_18);
              StringPiece::remove_prefix(this_01,(long)pcVar7 - (long)pcVar8);
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            RegexpStatus::set_code(*(RegexpStatus **)(in_RDI + 6),kRegexpBadNamedCapture);
            RegexpStatus::set_error_arg(*(RegexpStatus **)(in_RDI + 6),&local_1d0);
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.data()-2, end+3);  // "(?P<name>"
    StringPiece name(t.data()+2, end-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(
        static_cast<size_t>(capture.data() + capture.size() - s->data()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->data(), static_cast<size_t>(t.data() - s->data())));
  return false;
}